

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartsBupOutputter.cpp
# Opt level: O0

void __thiscall
PartsBupOutputter::setBase(PartsBupOutputter *this,path *basePath,Image *img,string *name)

{
  path *in_RCX;
  path *in_RDX;
  char *in_RSI;
  allocator<char> *in_RDI;
  path *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  Image *pIVar1;
  path *__p;
  Image *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  allocator<char> local_111;
  string local_110 [7];
  format in_stack_fffffffffffffef7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  path *in_stack_ffffffffffffff00;
  Image local_f0 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  path local_48;
  
  this_02 = &local_70;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef7);
  std::filesystem::__cxx11::operator/(in_RCX,in_RDX);
  this_00 = (path *)(in_RDI + 0x30);
  __p = &local_48;
  std::filesystem::__cxx11::path::operator=(this_00,__p);
  std::filesystem::__cxx11::path::~path(__p);
  std::filesystem::__cxx11::path::~path(__p);
  std::filesystem::create_directory(this_00);
  this_01 = local_f0;
  std::operator+(&in_RCX->_M_pathname,(char *)in_RDX);
  std::filesystem::__cxx11::u8path<std::__cxx11::string,std::filesystem::__cxx11::path,char>
            (in_stack_fffffffffffffe98);
  std::filesystem::__cxx11::operator/(in_RCX,in_RDX);
  pIVar1 = (Image *)&local_111;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_02,in_RSI,in_RDI);
  Image::writePNG(this_01,this_00,&__p->_M_pathname);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator(&local_111);
  std::filesystem::__cxx11::path::~path(__p);
  std::filesystem::__cxx11::path::~path(__p);
  std::__cxx11::string::~string((string *)local_f0);
  std::filesystem::__cxx11::path::operator=(this_00,__p);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x58),(string *)in_RCX);
  Image::operator=((Image *)__p,pIVar1);
  return;
}

Assistant:

void setBase(fs::path basePath, Image img, std::string name) override {
		partsPath = basePath/name;
		fs::create_directory(partsPath);
		img.writePNG(partsPath/fs::u8path(name + ".png"));
		this->basePath = std::move(basePath);
		baseName = std::move(name);
		base = std::move(img);
	}